

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenLDAP.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::OpenLDAP::rotateRootPassword_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,OpenLDAP *this)

{
  Client *client;
  allocator<char> local_b9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  char local_a8 [8];
  undefined8 uStack_a0;
  Path local_98;
  Url local_78;
  _Hashtable<_ea4cb122_> local_58;
  
  client = *(Client **)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"rotate-root",&local_b9);
  local_98.value_._M_dataplus._M_p = (pointer)&local_98.value_.field_2;
  if (local_b8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8) {
    local_98.value_.field_2._8_8_ = uStack_a0;
  }
  else {
    local_98.value_._M_dataplus._M_p = (pointer)local_b8;
  }
  local_98.value_._M_string_length = local_b0;
  local_b0 = 0;
  local_a8[0] = '\0';
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a8;
  getUrl(&local_78,this,&local_98);
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._4_4_ = 0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  HttpConsumer::post(__return_storage_ptr__,client,&local_78,(Parameters *)&local_58);
  std::_Hashtable<$ea4cb122$>::~_Hashtable(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::OpenLDAP::rotateRootPassword() {
  return HttpConsumer::post(client_, getUrl(Path{"rotate-root"}), Parameters{});
}